

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::Variable>::construct(BasicTypeInfo<dap::Variable> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::Variable> *this_local;
  
  memset(ptr,0,0x160);
  Variable::Variable((Variable *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }